

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O1

void __thiscall SymbolData::clear(SymbolData *this)

{
  SymDataModule defaultModule;
  value_type local_78;
  
  this->enabled = true;
  ghc::filesystem::path::clear(&this->nocashSymFileName);
  std::vector<SymDataModule,_std::allocator<SymDataModule>_>::_M_erase_at_end
            (&this->modules,
             (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->files,
                    (this->files).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->currentModule = 0;
  this->currentFunction = -1;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78.data._M_t._M_impl.super__Rb_tree_header._M_header;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.file = (AssemblerFile *)0x0;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<SymDataModule,_std::allocator<SymDataModule>_>::push_back(&this->modules,&local_78);
  std::
  _Rb_tree<SymDataData,_SymDataData,_std::_Identity<SymDataData>,_std::less<SymDataData>,_std::allocator<SymDataData>_>
  ::~_Rb_tree(&local_78.data._M_t);
  if (local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.functions.
                    super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.functions.
                          super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.functions.
                          super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::~vector(&local_78.symbols);
  return;
}

Assistant:

void SymbolData::clear()
{
	enabled = true;
	nocashSymFileName.clear();
	modules.clear();
	files.clear();
	currentModule = 0;
	currentFunction = -1;
	
	SymDataModule defaultModule;
	defaultModule.file = nullptr;
	modules.push_back(defaultModule);
}